

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall ValueTest::checkIs(ValueTest *this,Value *value,IsCheck *check)

{
  undefined1 *in_RDX;
  Value *in_RSI;
  long in_RDI;
  uint in_stack_ffffffffffffff1c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 uVar1;
  Value *this_00;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 uVar2;
  
  this_00 = *(Value **)(in_RDI + 8);
  uVar1 = *in_RDX;
  Json::Value::isObject(in_RSI);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             SUB81((ulong)this_00 >> 0x38,0),SUB81((ulong)this_00 >> 0x30,0),
             (char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c,
             (char *)0x146291);
  uVar2 = in_RDX[1];
  Json::Value::isArray(in_RSI);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1462ec);
  Json::Value::isBool(in_RSI);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x146347);
  Json::Value::isDouble((Value *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1463a2);
  Json::Value::isInt(this_00);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1463fd);
  Json::Value::isUInt(this_00);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x146458);
  Json::Value::isIntegral((Value *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1464b3);
  Json::Value::isNumeric((Value *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x146514);
  Json::Value::isString(in_RSI);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x14657b);
  Json::Value::isNull(in_RSI);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1465e2);
  Json::Value::isInt64(this_00);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x146649);
  Json::Value::isUInt64(this_00);
  JsonTest::checkEqual<bool,bool>
            ((TestResult *)CONCAT17(uVar2,in_stack_ffffffffffffff30),SUB81((ulong)this_00 >> 0x38,0)
             ,SUB81((ulong)this_00 >> 0x30,0),(char *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff1c,(char *)0x1466b0);
  return;
}

Assistant:

void ValueTest::checkIs(const Json::Value& value, const IsCheck& check) {
  JSONTEST_ASSERT_EQUAL(check.isObject_, value.isObject());
  JSONTEST_ASSERT_EQUAL(check.isArray_, value.isArray());
  JSONTEST_ASSERT_EQUAL(check.isBool_, value.isBool());
  JSONTEST_ASSERT_EQUAL(check.isDouble_, value.isDouble());
  JSONTEST_ASSERT_EQUAL(check.isInt_, value.isInt());
  JSONTEST_ASSERT_EQUAL(check.isUInt_, value.isUInt());
  JSONTEST_ASSERT_EQUAL(check.isIntegral_, value.isIntegral());
  JSONTEST_ASSERT_EQUAL(check.isNumeric_, value.isNumeric());
  JSONTEST_ASSERT_EQUAL(check.isString_, value.isString());
  JSONTEST_ASSERT_EQUAL(check.isNull_, value.isNull());

#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(check.isInt64_, value.isInt64());
  JSONTEST_ASSERT_EQUAL(check.isUInt64_, value.isUInt64());
#else
  JSONTEST_ASSERT_EQUAL(false, value.isInt64());
  JSONTEST_ASSERT_EQUAL(false, value.isUInt64());
#endif
}